

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void setnodevector(lua_State *L,Table *t,int size)

{
  Node *pNVar1;
  Node *local_38;
  Node *n;
  int local_20;
  int i;
  int lsize;
  int size_local;
  Table *t_local;
  lua_State *L_local;
  
  if (size == 0) {
    t->node = &dummynode_;
    local_20 = 0;
    i = 0;
  }
  else {
    local_20 = luaO_log2(size - 1);
    local_20 = local_20 + 1;
    if (0x1e < local_20) {
      luaG_runerror(L,"table overflow");
    }
    i = (int)(1L << ((byte)local_20 & 0x3f));
    if ((ulong)(long)(i + 1) < 0x666666666666667) {
      local_38 = (Node *)luaM_realloc_(L,(void *)0x0,0,(long)i * 0x28);
    }
    else {
      local_38 = (Node *)luaM_toobig(L);
    }
    t->node = local_38;
    for (n._4_4_ = 0; n._4_4_ < i; n._4_4_ = n._4_4_ + 1) {
      pNVar1 = t->node;
      pNVar1[n._4_4_].i_key.nk.next = (Node *)0x0;
      pNVar1[n._4_4_].i_key.nk.tt = 0;
      pNVar1[n._4_4_].i_val.tt = 0;
    }
  }
  t->lsizenode = (lu_byte)local_20;
  t->lastfree = t->node + i;
  return;
}

Assistant:

static void setnodevector(lua_State*L,Table*t,int size){
int lsize;
if(size==0){
t->node=cast(Node*,(&dummynode_));
lsize=0;
}
else{
int i;
lsize=ceillog2(size);
if(lsize>(32-2))
luaG_runerror(L,"table overflow");
size=twoto(lsize);
t->node=luaM_newvector(L,size,Node);
for(i=0;i<size;i++){
Node*n=gnode(t,i);
gnext(n)=NULL;
setnilvalue(gkey(n));
setnilvalue(gval(n));
}
}
t->lsizenode=cast_byte(lsize);
t->lastfree=gnode(t,size);
}